

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O3

PointSet * __thiscall
hnsw::HNSWIndex::SelectNeighborsHeuristic
          (PointSet *__return_storage_ptr__,HNSWIndex *this,float *q,PointSet *candidates,uint32_t M
          )

{
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  __last;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  __first;
  pointer ppVar1;
  pointer ppfVar2;
  iterator __position;
  pointer ppVar3;
  pointer ppVar4;
  PointSet *__range3;
  pair<unsigned_int,_float> *neighbor;
  ulong __n;
  float fVar5;
  Point p;
  MinHeap closest_points;
  PointGreaterComparator local_69;
  undefined1 local_68 [8];
  pointer ppStack_60;
  pointer local_58;
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
  local_50;
  
  __last._M_current =
       (candidates->
       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  __first._M_current =
       (candidates->
       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __n = (ulong)M;
  if (__n < (ulong)((long)__last._M_current - (long)__first._M_current >> 3)) {
    local_68._0_4_ = 0;
    local_68._4_4_ = 0.0;
    ppStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    std::
    priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
    ::
    priority_queue<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,float>*,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>
              ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
                *)&local_50,__first,__last,&local_69,
               (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)local_68);
    if ((pair<unsigned_int,_float>)local_68 != (pair<unsigned_int,_float>)0x0) {
      operator_delete((void *)local_68);
    }
    fVar5 = 0.0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    reserve(__return_storage_ptr__,__n);
    if (local_50.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_50.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_68 = *(undefined1 (*) [8])
                    local_50.c.
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        std::
        priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
        ::pop(&local_50);
        ppVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        ppVar4 = ppVar3;
        if (ppVar3 != ppVar1) {
          do {
            ppVar4 = ppVar4 + 1;
          } while (ppVar4 != ppVar1);
          for (; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
            ppfVar2 = (this->points_).row_ptrs_.
                      super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            (**this->distance_->_vptr_Distance)
                      (this->distance_,ppfVar2[(ulong)local_68 & 0xffffffff],ppfVar2[ppVar3->first])
            ;
            if (fVar5 < (float)local_68._4_4_) goto LAB_0010647f;
          }
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
          _M_realloc_insert<std::pair<unsigned_int,float>const&>
                    ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                      *)__return_storage_ptr__,__position,(pair<unsigned_int,_float> *)local_68);
          ppVar3 = (__return_storage_ptr__->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->first = local_68._0_4_;
          (__position._M_current)->second = (float)local_68._4_4_;
          ppVar3 = (__return_storage_ptr__->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 1;
          (__return_storage_ptr__->
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = ppVar3;
        }
        if ((long)ppVar3 -
            (long)(__return_storage_ptr__->
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3 == __n) break;
LAB_0010647f:
      } while (local_50.c.
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_50.c.
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_50.c.
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_float> *)0x0) {
      operator_delete(local_50.c.
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    vector(__return_storage_ptr__,candidates);
  }
  return __return_storage_ptr__;
}

Assistant:

PointSet SelectNeighborsHeuristic(const float *q, PointSet &candidates, uint32_t M) {
    if (candidates.size() <= M) {
      return candidates;
    }

    MinHeap closest_points(candidates.begin(), candidates.end());

    PointSet selected_points;
    selected_points.reserve(M);
    while (!closest_points.empty()) {
      Point p = closest_points.top();
      closest_points.pop();

      bool is_nearest = true;

#ifdef PREFETCH_DATA
      // prefetch into cache
      for (const auto &neighbor : selected_points) {
        _mm_prefetch(points_[neighbor.first], _MM_HINT_T0);
      }
#endif

      for (const auto &neighbor : selected_points) {
        float dist = distance_(points_[p.first], points_[neighbor.first]);
        if (dist < p.second) {
          is_nearest = false;
          break;
        }
      }
      if (is_nearest) {
        selected_points.push_back(p);
        if (selected_points.size() == M) {
          break;
        }
      }
    }

    return selected_points;
  }